

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdtr.c
# Opt level: O0

double hcephes_pdtrc(int k,double m)

{
  double v;
  double m_local;
  double dStack_10;
  int k_local;
  
  if ((k < 0) || (m <= 0.0)) {
    hcephes_mtherr("pdtrc",1);
    dStack_10 = 0.0;
  }
  else {
    dStack_10 = hcephes_igam((double)(k + 1),m);
  }
  return dStack_10;
}

Assistant:

HCEPHES_API double hcephes_pdtrc(int k, double m) {
    double v;

    if ((k < 0) || (m <= 0.0)) {
        hcephes_mtherr("pdtrc", HCEPHES_DOMAIN);
        return (0.0);
    }
    v = k + 1;
    return (hcephes_igam(v, m));
}